

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O3

void __thiscall tcu::TestNode::addChild(TestNode *this,TestNode *node)

{
  pointer *pppTVar1;
  iterator __position;
  TestNode *local_8;
  
  __position._M_current =
       (this->m_children).super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_children).super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = node;
    std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::
    _M_realloc_insert<tcu::TestNode*const&>
              ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)&this->m_children,__position
               ,&local_8);
  }
  else {
    *__position._M_current = node;
    pppTVar1 = &(this->m_children).
                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  return;
}

Assistant:

void TestNode::addChild (TestNode* node)
{
	// Child names must be unique!
	// \todo [petri] O(n^2) algorithm, but shouldn't really matter..
#if defined(DE_DEBUG)
	for (int i = 0; i < (int)m_children.size(); i++)
	{
		if (deStringEqual(node->getName(), m_children[i]->getName()))
			throw tcu::InternalError(std::string("Test case with non-unique name '") + node->getName() + "' added to group '" + getName() + "'.");
	}
#endif

	// children only in group nodes
	DE_ASSERT(getTestNodeTypeClass(m_nodeType) == NODECLASS_GROUP);

	// children must have the same class
	if (!m_children.empty())
		DE_ASSERT(getTestNodeTypeClass(m_children.front()->getNodeType()) == getTestNodeTypeClass(node->getNodeType()));

	m_children.push_back(node);
}